

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::removeSource(DefaultUnfoundedCheck *this,NodeId bodyId)

{
  bool bVar1;
  NodeId NVar2;
  BodyNode *this_00;
  DefaultUnfoundedCheck *this_01;
  DefaultUnfoundedCheck *pDVar3;
  reference pAVar4;
  NodeId in_ESI;
  uint *in_RDI;
  DefaultUnfoundedCheck *unaff_retaddr;
  NodeId *x;
  BodyNode *body;
  NodeId in_stack_ffffffffffffffcc;
  PrgDepGraph *in_stack_ffffffffffffffd0;
  DefaultUnfoundedCheck *this_02;
  
  this_00 = Asp::PrgDepGraph::getBody(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  this_01 = (DefaultUnfoundedCheck *)Asp::PrgDepGraph::BodyNode::heads_begin(this_00);
  while (this_02 = this_01,
        pDVar3 = (DefaultUnfoundedCheck *)Asp::PrgDepGraph::BodyNode::heads_end((BodyNode *)this_01)
        , this_01 != pDVar3) {
    pAVar4 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                           *)(in_RDI + 10),
                          *(size_type *)
                           &(this_02->super_PostPropagator).super_Constraint._vptr_Constraint);
    NVar2 = AtomData::watch(pAVar4);
    if (NVar2 == in_ESI) {
      pAVar4 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                             *)(in_RDI + 10),
                            *(size_type *)
                             &(this_02->super_PostPropagator).super_Constraint._vptr_Constraint);
      bVar1 = AtomData::hasSource(pAVar4);
      if (bVar1) {
        pAVar4 = bk_lib::
                 pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                 ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                               *)(in_RDI + 10),
                              *(size_type *)
                               &(this_02->super_PostPropagator).super_Constraint._vptr_Constraint);
        AtomData::markSourceInvalid(pAVar4);
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02,in_RDI);
      }
      pushTodo(this_01,in_stack_ffffffffffffffcc);
    }
    this_01 = (DefaultUnfoundedCheck *)
              ((long)&(this_02->super_PostPropagator).super_Constraint._vptr_Constraint + 4);
  }
  propagateSource(unaff_retaddr);
  return;
}

Assistant:

void DefaultUnfoundedCheck::removeSource(NodeId bodyId) {
	const BodyNode& body = graph_->getBody(bodyId);
	for (const NodeId* x = body.heads_begin(); x != body.heads_end(); ++x) {
		if (atoms_[*x].watch() == bodyId) {
			if (atoms_[*x].hasSource()) {
				atoms_[*x].markSourceInvalid();
				sourceQ_.push_back(*x);
			}
			pushTodo(*x);
		}
	}
	propagateSource();
}